

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O3

char * Bbl_ManTruthToSop(uint *pTruth,int nVars)

{
  int iVar1;
  ulong uVar2;
  char *__s;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  char *__size;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  ulong in_XMM9_Qa;
  uint uVar13;
  undefined8 in_XMM9_Qb;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM13 [16];
  uint uVar19;
  
  if (0x10 < (uint)nVars) {
    __assert_fail("nVars >= 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                  ,0x4fd,"char *Bbl_ManTruthToSop(unsigned int *, int)");
  }
  uVar6 = 1 << ((byte)nVars & 0x1f);
  iVar1 = uVar6 - 1;
  auVar7._4_4_ = iVar1;
  auVar7._0_4_ = iVar1;
  auVar7._8_4_ = iVar1;
  auVar7._12_4_ = iVar1;
  uVar3 = 0;
  auVar7 = auVar7 ^ _DAT_007ee2e0;
  auVar11 = _DAT_007f4540;
  auVar9 = (undefined1  [16])0x0;
  do {
    auVar15 = auVar9;
    auVar9 = auVar11 ^ _DAT_007ee2e0;
    auVar10._0_4_ = -(uint)(auVar7._0_4_ < auVar9._0_4_);
    auVar10._4_4_ = -(uint)(auVar7._4_4_ < auVar9._4_4_);
    auVar10._8_4_ = -(uint)(auVar7._8_4_ < auVar9._8_4_);
    auVar10._12_4_ = -(uint)(auVar7._12_4_ < auVar9._12_4_);
    if ((~auVar10._0_4_ & 1) != 0) {
      in_XMM9_Qa = (ulong)pTruth[uVar3 >> 5];
      in_XMM9_Qb = 0;
    }
    auVar17._8_4_ = 0xffffffff;
    auVar17._0_8_ = 0xffffffffffffffff;
    auVar17._12_4_ = 0xffffffff;
    auVar16 = auVar10 ^ auVar17;
    if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      in_XMM9_Qa = CONCAT44(pTruth[uVar3 >> 5],(int)in_XMM9_Qa);
    }
    uVar12 = (uint)in_XMM9_Qa;
    if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      in_XMM9_Qb = CONCAT44((int)((ulong)in_XMM9_Qb >> 0x20),pTruth[uVar3 >> 5]);
    }
    if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      auVar16._4_4_ = 0;
      auVar16._0_4_ = pTruth[uVar3 >> 5];
      auVar16._8_4_ = (int)in_XMM9_Qb;
      auVar16._12_4_ = (int)((ulong)in_XMM9_Qb >> 0x20);
      in_XMM9_Qb = CONCAT44(pTruth[uVar3 >> 5],(int)in_XMM9_Qb);
    }
    auVar9 = auVar11 & _DAT_007f4550;
    auVar17 = pshuflw(auVar16,auVar9,0xfe);
    uVar2 = in_XMM9_Qa >> 0x20;
    auVar16 = pshuflw(in_XMM13,auVar9,0x54);
    uVar14 = (uint)((ulong)in_XMM9_Qb >> 0x20);
    auVar18._8_4_ = auVar9._8_4_;
    auVar18._12_4_ = auVar9._12_4_;
    auVar18._0_8_ = auVar9._8_8_;
    in_XMM13 = pshuflw(auVar16,auVar18,0xfe);
    uVar19 = uVar14 >> in_XMM13._0_8_;
    auVar9 = pshuflw(auVar18,auVar18,0x54);
    uVar13 = (uint)in_XMM9_Qb >> auVar9._0_8_;
    in_XMM9_Qa = CONCAT44(uVar14 >> auVar9._0_8_,uVar13);
    in_XMM9_Qb = CONCAT44(uVar19,(uint)in_XMM9_Qb >> in_XMM13._0_8_);
    auVar9._0_4_ = (uVar12 >> auVar16._0_8_ & 1) + auVar15._0_4_;
    auVar9._4_4_ = ((uint)uVar2 >> auVar17._0_8_ & 1) + auVar15._4_4_;
    auVar9._8_4_ = (uVar13 & 1) + auVar15._8_4_;
    auVar9._12_4_ = (uVar19 & 1) + auVar15._12_4_;
    uVar3 = uVar3 + 4;
    auVar8._0_4_ = auVar11._0_4_ + 4;
    auVar8._4_4_ = auVar11._4_4_ + 4;
    auVar8._8_4_ = auVar11._8_4_ + 4;
    auVar8._12_4_ = auVar11._12_4_ + 4;
    auVar11 = auVar8;
  } while ((uVar6 + 3 & 0xfffffffc) != uVar3);
  auVar11 = ~auVar10 & auVar9 | auVar15 & auVar10;
  uVar3 = auVar11._12_4_ + auVar11._4_4_ + auVar11._8_4_ + auVar11._0_4_;
  if (uVar3 == 0 || uVar3 == uVar6) {
    __s = (char *)malloc((size_t)(ulong)(nVars + 4));
    pcVar5 = __s;
    if (nVars != 0) {
      memset(__s,0x2d,(ulong)(uint)nVars);
      pcVar5 = __s + (uint)nVars;
    }
    *pcVar5 = ' ';
    pcVar5[1] = uVar3 == 0 ^ 0x31;
    pcVar5[2] = '\n';
    pcVar5[3] = '\0';
    if (pcVar5 + (4 - (long)__s) != (char *)(ulong)(nVars + 4)) {
      __assert_fail("pTemp - pResult == nVars + 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                    ,0x50d,"char *Bbl_ManTruthToSop(unsigned int *, int)");
    }
  }
  else {
    __size = (char *)(long)(int)(uVar3 * (nVars + 3) + 1);
    __s = (char *)malloc((size_t)__size);
    uVar3 = 0;
    pcVar5 = __s;
    do {
      if ((pTruth[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0) {
        if (nVars != 0) {
          lVar4 = 0;
          do {
            pcVar5[lVar4] = (uVar3 >> ((uint)lVar4 & 0x1f) & 1) == 0 ^ 0x31;
            lVar4 = lVar4 + 1;
          } while (nVars != (int)lVar4);
          pcVar5 = pcVar5 + lVar4;
        }
        pcVar5[0] = ' ';
        pcVar5[1] = '1';
        pcVar5[2] = '\n';
        pcVar5 = pcVar5 + 3;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar6);
    *pcVar5 = '\0';
    if (pcVar5 + (1 - (long)__s) != __size) {
      __assert_fail("pTemp - pResult == nOnes * (nVars + 3) + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                    ,0x51c,"char *Bbl_ManTruthToSop(unsigned int *, int)");
    }
  }
  return __s;
}

Assistant:

char * Bbl_ManTruthToSop( unsigned * pTruth, int nVars )
{
    char * pResult, * pTemp;
    int nMints, nOnes, b, v;
    assert( nVars >= 0 && nVars <= 16 );
    nMints = (1 << nVars);
    // count the number of ones
    nOnes = 0;
    for ( b = 0; b < nMints; b++ )
        nOnes += ((pTruth[b>>5] >> (b&31)) & 1);
    // handle constants
    if ( nOnes == 0 || nOnes == nMints )
    {
        pResult = pTemp = BBLIF_ALLOC( char, nVars + 4 );        
        for ( v = 0; v < nVars; v++ )
            *pTemp++ = '-';
        *pTemp++ = ' ';
        *pTemp++ = nOnes? '1' : '0';
        *pTemp++ = '\n';
        *pTemp++ = 0;
        assert( pTemp - pResult == nVars + 4 );
        return pResult;
    }
    pResult = pTemp = BBLIF_ALLOC( char, nOnes * (nVars + 3) + 1 );        
    for ( b = 0; b < nMints; b++ )
    {
        if ( ((pTruth[b>>5] >> (b&31)) & 1) == 0 )
            continue;
        for ( v = 0; v < nVars; v++ )
            *pTemp++ = ((b >> v) & 1)? '1' : '0';
        *pTemp++ = ' ';
        *pTemp++ = '1';
        *pTemp++ = '\n';
    }
    *pTemp++ = 0;
    assert( pTemp - pResult == nOnes * (nVars + 3) + 1 );
    return pResult;
}